

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ini_file.cxx
# Opt level: O1

bool __thiscall xray_re::xr_ini_file::load(xr_ini_file *this,xr_reader *r)

{
  bool bVar1;
  
  if (r->m_data <= r->m_end) {
    bVar1 = parse(this,(r->field_2).m_p_s8,(r->field_2).m_p_s8 + ((long)r->m_end - (long)r->m_data),
                  "embedded");
    if (!bVar1) {
      trim_container<std::vector<xray_re::xr_ini_file::ini_section*,std::allocator<xray_re::xr_ini_file::ini_section*>>>
                (&this->m_sections);
    }
    return bVar1;
  }
  __assert_fail("m_data <= m_end",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_reader.h"
                ,0x7a,"size_t xray_re::xr_reader::size() const");
}

Assistant:

bool xr_ini_file::r_line(const char* sname, size_t lindex, const char** lname, const char** lvalue) const
{
	const ini_section* section = r_section(sname);
	if (lindex >= section->size())
		return false;
	const ini_item* item = section->items[lindex];
	if (lname)
		*lname = item->name.c_str();
	if (lvalue)
		*lvalue = item->value.c_str();
	return true;
}